

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

PropertyId
Js::TPropertyKey_GetUpdateSideEffectPropertyId<Js::JavascriptString*>
          (PropertyId propertyId,JavascriptString *propertyKey)

{
  bool bVar1;
  uint uVar2;
  
  if (propertyId != -1) {
    return propertyId;
  }
  bVar1 = BuiltInPropertyRecord<8>::Equals
                    ((BuiltInPropertyRecord<8> *)BuiltInPropertyRecords::valueOf,propertyKey);
  uVar2 = 0x18e;
  if (!bVar1) {
    bVar1 = BuiltInPropertyRecord<9>::Equals
                      ((BuiltInPropertyRecord<9> *)BuiltInPropertyRecords::toString,propertyKey);
    uVar2 = bVar1 - 1 | 0x178;
  }
  return uVar2;
}

Assistant:

PropertyId TPropertyKey_GetUpdateSideEffectPropertyId<JavascriptString *>(PropertyId propertyId, JavascriptString * propertyKey)
    {
        if (propertyId != Js::Constants::NoProperty)
        {
            return propertyId;
        }
        if (BuiltInPropertyRecords::valueOf.Equals(propertyKey))
        {
            return PropertyIds::valueOf;
        }
        if (BuiltInPropertyRecords::toString.Equals(propertyKey))
        {
           return PropertyIds::toString;
        }
        return Js::Constants::NoProperty;
    }